

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void int_list_diff(int *a,int *b,int *c)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
code_r0x00147e86:
  iVar2 = *b;
  if (-1 < iVar2) {
    while( true ) {
      if (*c < 0) goto LAB_00147ecf;
      while( true ) {
        piVar3 = b + 1;
        iVar1 = *c;
        if (iVar2 == iVar1) {
          c = c + 1;
          b = piVar3;
          goto code_r0x00147e86;
        }
        if (iVar1 <= iVar2) break;
        *a = iVar2;
        a = a + 1;
        iVar2 = *piVar3;
        b = piVar3;
        if (iVar2 < 0) goto LAB_00147ed7;
      }
      if (iVar2 <= iVar1) break;
      c = c + 1;
    }
    goto code_r0x00147e86;
  }
LAB_00147ed7:
  *a = -1;
  return;
LAB_00147ecf:
  while (b = b + 1, -1 < iVar2) {
    *a = iVar2;
    a = a + 1;
    iVar2 = *b;
  }
  goto LAB_00147ed7;
}

Assistant:

void int_list_diff(int *a, int *b, int *c) {
  while (1) {
    if (*b < 0) break;
  Lagainc:
    if (*c < 0) {
      while (*b >= 0) *a++ = *b++;
      break;
    }
  Lagainb:
    if (*b == *c) {
      b++;
      c++;
      continue;
    }
    if (*b < *c) {
      *a++ = *b++;
      if (*b < 0) break;
      goto Lagainb;
    }
    if (*c < *b) {
      c++;
      goto Lagainc;
    }
  }
  *a++ = -1;
}